

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::LegacyScriptPubKeyMan::Upgrade
          (LegacyScriptPubKeyMan *this,int prev_version,int new_version,bilingual_str *error)

{
  long lVar1;
  WalletStorage *pWVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  long *plVar6;
  runtime_error *this_00;
  bool bVar7;
  long in_FS_OFFSET;
  allocator<char> local_b1;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  CPubKey masterPubKey;
  undefined4 extraout_var;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock8,&(this->super_LegacyDataSPKM).super_FillableSigningProvider.cs_KeyStore
             ,"cs_KeyStore",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/scriptpubkeyman.cpp"
             ,0x1dd,false);
  pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
  iVar5 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,0x100000000);
  bVar7 = true;
  if ((char)iVar5 == '\0') {
    bVar3 = IsFeatureSupported(new_version,130000);
    if (bVar3) {
      iVar5 = (*(this->super_LegacyDataSPKM).super_ScriptPubKeyMan._vptr_ScriptPubKeyMan[0xc])(this)
      ;
      if ((char)iVar5 != '\0') goto LAB_001f0695;
      ScriptPubKeyMan::WalletLogPrintf<>
                ((ScriptPubKeyMan *)this,(ConstevalFormatString<0U>)0x3f827a);
      pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
      (*pWVar2->_vptr_WalletStorage[7])(pWVar2,130000,0);
      GenerateNewSeed(&masterPubKey,this);
      SetHDSeed(this,&masterPubKey);
      bVar3 = true;
    }
    else {
LAB_001f0695:
      bVar3 = false;
    }
    bVar4 = IsFeatureSupported(prev_version,0x2227c);
    if (!bVar4) {
      bVar4 = IsFeatureSupported(new_version,0x2227c);
      if (bVar4) {
        ScriptPubKeyMan::WalletLogPrintf<>
                  ((ScriptPubKeyMan *)this,(ConstevalFormatString<0U>)0x3f8292);
        pWVar2 = (this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage;
        (*pWVar2->_vptr_WalletStorage[7])(pWVar2,0x297ac,0);
        if ((this->super_LegacyDataSPKM).m_hd_chain.nVersion < 2) {
          (this->super_LegacyDataSPKM).m_hd_chain.nVersion = 2;
          iVar5 = (*((this->super_LegacyDataSPKM).super_ScriptPubKeyMan.m_storage)->
                    _vptr_WalletStorage[3])();
          plVar6 = (long *)CONCAT44(extraout_var,iVar5);
          (**(code **)(*plVar6 + 0x70))(&masterPubKey,plVar6,1);
          masterPubKey.vch._8_8_ = plVar6;
          bVar4 = WalletBatch::WriteHDChain
                            ((WalletBatch *)&masterPubKey,&(this->super_LegacyDataSPKM).m_hd_chain);
          if (masterPubKey.vch._0_8_ != 0) {
            (**(code **)(*(long *)masterPubKey.vch._0_8_ + 0x28))();
          }
          if (!bVar4) {
            this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_a0,"Upgrade",&local_b1);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &masterPubKey,&local_a0,": writing chain failed");
            std::runtime_error::runtime_error(this_00,(string *)&masterPubKey);
            if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            goto LAB_001f0919;
          }
        }
        if (prev_version < 0x2227c) {
          MarkPreSplitKeys(this);
        }
      }
    }
    if (bVar3) {
      bVar3 = NewKeyPool(this);
      if (!bVar3) {
        _((bilingual_str *)&masterPubKey,(ConstevalStringLiteral)0x3f82d9);
        bilingual_str::operator=(error,(bilingual_str *)&masterPubKey);
        bilingual_str::~bilingual_str((bilingual_str *)&masterPubKey);
        bVar7 = false;
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock8.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar7;
  }
LAB_001f0919:
  __stack_chk_fail();
}

Assistant:

bool LegacyScriptPubKeyMan::Upgrade(int prev_version, int new_version, bilingual_str& error)
{
    LOCK(cs_KeyStore);

    if (m_storage.IsWalletFlagSet(WALLET_FLAG_DISABLE_PRIVATE_KEYS)) {
        // Nothing to do here if private keys are not enabled
        return true;
    }

    bool hd_upgrade = false;
    bool split_upgrade = false;
    if (IsFeatureSupported(new_version, FEATURE_HD) && !IsHDEnabled()) {
        WalletLogPrintf("Upgrading wallet to HD\n");
        m_storage.SetMinVersion(FEATURE_HD);

        // generate a new master key
        CPubKey masterPubKey = GenerateNewSeed();
        SetHDSeed(masterPubKey);
        hd_upgrade = true;
    }
    // Upgrade to HD chain split if necessary
    if (!IsFeatureSupported(prev_version, FEATURE_HD_SPLIT) && IsFeatureSupported(new_version, FEATURE_HD_SPLIT)) {
        WalletLogPrintf("Upgrading wallet to use HD chain split\n");
        m_storage.SetMinVersion(FEATURE_PRE_SPLIT_KEYPOOL);
        split_upgrade = FEATURE_HD_SPLIT > prev_version;
        // Upgrade the HDChain
        if (m_hd_chain.nVersion < CHDChain::VERSION_HD_CHAIN_SPLIT) {
            m_hd_chain.nVersion = CHDChain::VERSION_HD_CHAIN_SPLIT;
            if (!WalletBatch(m_storage.GetDatabase()).WriteHDChain(m_hd_chain)) {
                throw std::runtime_error(std::string(__func__) + ": writing chain failed");
            }
        }
    }
    // Mark all keys currently in the keypool as pre-split
    if (split_upgrade) {
        MarkPreSplitKeys();
    }
    // Regenerate the keypool if upgraded to HD
    if (hd_upgrade) {
        if (!NewKeyPool()) {
            error = _("Unable to generate keys");
            return false;
        }
    }
    return true;
}